

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  int iVar2;
  EpsCopyInputStream *in_RCX;
  int in_ESI;
  long *in_RDI;
  string *in_stack_ffffffffffffff98;
  uint64 in_stack_ffffffffffffffa0;
  char *local_30;
  char *local_8;
  
  if (*in_RDI != 0) {
    WriteVarint(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  iVar2 = *(int *)&in_RCX[1].limit_end_ + -1;
  *(int *)&in_RCX[1].limit_end_ = iVar2;
  if (iVar2 < 0) {
    local_8 = (char *)0x0;
  }
  else {
    *(int *)((long)&in_RCX[1].limit_end_ + 4) = *(int *)((long)&in_RCX[1].limit_end_ + 4) + 1;
    local_8 = _InternalParse((UnknownFieldLiteParserHelper *)in_RCX,
                             (char *)in_stack_ffffffffffffff98,(ParseContext *)0x3f2c5e);
    *(int *)((long)&in_RCX[1].limit_end_ + 4) = *(int *)((long)&in_RCX[1].limit_end_ + 4) + -1;
    *(int *)&in_RCX[1].limit_end_ = *(int *)&in_RCX[1].limit_end_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(in_RCX,in_ESI * 8 + 3);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_8 = (char *)0x0;
    }
  }
  if (local_8 == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    if (*in_RDI != 0) {
      WriteVarint((uint64)in_RCX,in_stack_ffffffffffffff98);
    }
    local_30 = local_8;
  }
  return local_30;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }